

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_4::CreatePixmapSurfaceCase::executeForConfig
          (CreatePixmapSurfaceCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *poVar1;
  bool bVar2;
  TestLog *pTVar3;
  NativeDisplay *pNVar4;
  EGLint EVar5;
  deUint32 dVar6;
  int iVar7;
  Library *egl;
  NativePixmapFactory *pNVar8;
  NotSupportedError *this_00;
  NativePixmap *pNVar9;
  undefined4 extraout_var;
  undefined8 uVar10;
  EGLSurface surface_00;
  undefined4 extraout_var_01;
  char *platformExt;
  EGLint pixmapHeight;
  EGLDisplay local_1f8;
  EGLint pixmapWidth;
  EGLConfig local_1e8;
  TestLog *local_1e0;
  UniqueSurface surface;
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> pixmap;
  MessageBuilder local_1b0;
  Library *egl_00;
  undefined4 extraout_var_00;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  local_1f8 = display;
  local_1e8 = config;
  EVar5 = eglu::getConfigID(egl,display,config);
  pNVar8 = eglu::selectNativePixmapFactory
                     (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                      m_nativeDisplayFactory,
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_cmdLine);
  if (this->m_useLegacyCreate == true) {
    if ((*(uint *)(pNVar8 + 0x48) & 1) != 0) {
LAB_002355e2:
      poVar1 = &local_1b0.m_str;
      local_1e0 = pTVar3;
      local_1b0.m_log = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Creating pixmap surface with config ID ");
      std::ostream::operator<<(poVar1,EVar5);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar6,"init",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0xc3);
      pNVar9 = (NativePixmap *)
               (**(code **)(*(long *)pNVar8 + 0x20))
                         (pNVar8,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                 m_nativeDisplay).
                                 super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                 .m_data.ptr,local_1f8,local_1e8,0,0x40,0x40);
      pNVar4 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      bVar2 = this->m_useLegacyCreate;
      pixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data.
      ptr = pNVar9;
      iVar7 = (*pNVar4->_vptr_NativeDisplay[2])(pNVar4);
      egl_00 = (Library *)CONCAT44(extraout_var,iVar7);
      if (bVar2 == false) {
        platformExt = (char *)(pNVar4->m_platformExtension)._M_string_length;
        if (platformExt != (char *)0x0) {
          platformExt = (pNVar4->m_platformExtension)._M_dataplus._M_p;
        }
        checkEGLPlatformSupport(egl_00,platformExt);
        uVar10 = (**(code **)(*(long *)pNVar9 + 0x18))(pNVar9);
        iVar7 = (*egl_00->_vptr_Library[0xd])(egl_00,local_1f8,local_1e8,uVar10,0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_01,iVar7);
        dVar6 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar6,"eglCreatePlatformPixmapSurfaceEXT() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x65);
      }
      else {
        uVar10 = (**(code **)(*(long *)pNVar9 + 0x10))(pNVar9);
        iVar7 = (*egl_00->_vptr_Library[0xb])(egl_00,local_1f8,local_1e8,uVar10,0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_00,iVar7);
        dVar6 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar6,"eglCreatePixmapSurface() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x5e);
      }
      eglu::UniqueSurface::UniqueSurface(&surface,egl,local_1f8,surface_00);
      pixmapWidth = 0;
      pixmapHeight = 0;
      (*egl->_vptr_Library[0x2b])(egl,local_1f8,surface.m_surface,0x3057);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar6,"querySurface(display, *surface, EGL_WIDTH, &pixmapWidth)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0xcd);
      (*egl->_vptr_Library[0x2b])(egl,local_1f8,surface.m_surface,0x3056,&pixmapHeight);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar6,"querySurface(display, *surface, EGL_HEIGHT, &pixmapHeight)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0xce);
      if ((pixmapWidth < 1) || (pixmapHeight < 1)) {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = local_1e0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"  Fail, invalid surface size ");
        std::ostream::operator<<(poVar1,pixmapWidth);
        std::operator<<((ostream *)poVar1,"x");
        std::ostream::operator<<(poVar1,pixmapHeight);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Invalid surface size");
      }
      else {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = local_1e0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"  Pass");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      eglu::UniqueSurface::~UniqueSurface(&surface);
      de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
      ~UniqueBase(&pixmap.
                   super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>);
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native pixmap doesn\'t support legacy eglCreatePixmapSurface()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0xba);
  }
  else {
    if ((*(uint *)(pNVar8 + 0x48) & 2) != 0) goto LAB_002355e2;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native pixmap doesn\'t support eglCreatePlatformPixmapSurfaceEXT()",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0xbf);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		TestLog&							log				= m_testCtx.getLog();
		EGLint								id				= eglu::getConfigID(egl, display, config);
		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		// \todo [2011-03-23 pyry] Iterate thru all possible combinations of EGL_RENDER_BUFFER, EGL_VG_COLORSPACE and EGL_VG_ALPHA_FORMAT

		if (m_useLegacyCreate)
		{
			if ((pixmapFactory.getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support legacy eglCreatePixmapSurface()");
		}
		else
		{
			if ((pixmapFactory.getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_PLATFORM) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support eglCreatePlatformPixmapSurfaceEXT()");
		}

		log << TestLog::Message << "Creating pixmap surface with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		{
			const int							width			= 64;
			const int							height			= 64;
			de::UniquePtr<eglu::NativePixmap>	pixmap			(pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));
			eglu::UniqueSurface					surface			(egl, display, createPixmapSurface(display, config, m_eglTestCtx.getNativeDisplay(), *pixmap, m_useLegacyCreate));
			EGLint								pixmapWidth		= 0;
			EGLint								pixmapHeight	= 0;

			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_WIDTH,		&pixmapWidth));
			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_HEIGHT,	&pixmapHeight));

			if (pixmapWidth <= 0 || pixmapHeight <= 0)
			{
				log << TestLog::Message << "  Fail, invalid surface size " << pixmapWidth << "x" << pixmapHeight << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
			}
			else
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}